

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindWindowFocusIndex(ImGuiWindow *window)

{
  short sVar1;
  ImGuiWindow **ppIVar2;
  int order;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  sVar1 = window->FocusOrder;
  if (window->RootWindow != window) {
    __assert_fail("window->RootWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2905,"int ImGui::FindWindowFocusIndex(ImGuiWindow *)");
  }
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&GImGui->WindowsFocusOrder,(int)sVar1);
  if (*ppIVar2 == window) {
    return (int)sVar1;
  }
  __assert_fail("g.WindowsFocusOrder[order] == window",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x2906,"int ImGui::FindWindowFocusIndex(ImGuiWindow *)");
}

Assistant:

static int ImGui::FindWindowFocusIndex(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(g);
    int order = window->FocusOrder;
    IM_ASSERT(window->RootWindow == window); // No child window (not testing _ChildWindow because of docking)
    IM_ASSERT(g.WindowsFocusOrder[order] == window);
    return order;
}